

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContextOptimizationOverrideInfo.cpp
# Opt level: O2

void __thiscall
Js::ScriptContextOptimizationOverrideInfo::Verify(ScriptContextOptimizationOverrideInfo *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ScriptContextOptimizationOverrideInfo *pSVar4;
  
  if (this->crossSiteRoot != (ScriptContextOptimizationOverrideInfo *)0x0) {
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    pSVar4 = this;
    do {
      if (pSVar4->crossSiteRoot != this->crossSiteRoot) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar3 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContextOptimizationOverrideInfo.cpp"
                                    ,0x105,"(i->crossSiteRoot == this->crossSiteRoot)",
                                    "i->crossSiteRoot == this->crossSiteRoot");
        if (!bVar2) goto LAB_00709451;
        *puVar3 = 0;
      }
      if (pSVar4->sideEffects != this->sideEffects) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar3 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContextOptimizationOverrideInfo.cpp"
                                    ,0x106,"(i->sideEffects == this->sideEffects)",
                                    "i->sideEffects == this->sideEffects");
        if (!bVar2) goto LAB_00709451;
        *puVar3 = 0;
      }
      if (pSVar4->arraySetElementFastPathVtable != this->arraySetElementFastPathVtable) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar3 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContextOptimizationOverrideInfo.cpp"
                                    ,0x107,
                                    "(i->arraySetElementFastPathVtable == this->arraySetElementFastPathVtable)"
                                    ,
                                    "i->arraySetElementFastPathVtable == this->arraySetElementFastPathVtable"
                                   );
        if (!bVar2) goto LAB_00709451;
        *puVar3 = 0;
      }
      if (pSVar4->intArraySetElementFastPathVtable != this->intArraySetElementFastPathVtable) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar3 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContextOptimizationOverrideInfo.cpp"
                                    ,0x108,
                                    "(i->intArraySetElementFastPathVtable == this->intArraySetElementFastPathVtable)"
                                    ,
                                    "i->intArraySetElementFastPathVtable == this->intArraySetElementFastPathVtable"
                                   );
        if (!bVar2) goto LAB_00709451;
        *puVar3 = 0;
      }
      if (pSVar4->floatArraySetElementFastPathVtable != this->floatArraySetElementFastPathVtable) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar3 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContextOptimizationOverrideInfo.cpp"
                                    ,0x109,
                                    "(i->floatArraySetElementFastPathVtable == this->floatArraySetElementFastPathVtable)"
                                    ,
                                    "i->floatArraySetElementFastPathVtable == this->floatArraySetElementFastPathVtable"
                                   );
        if (!bVar2) {
LAB_00709451:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar3 = 0;
      }
      pSVar4 = pSVar4->crossSiteNext;
    } while (pSVar4 != this);
  }
  return;
}

Assistant:

void
ScriptContextOptimizationOverrideInfo::Verify()
{
    if (this->crossSiteRoot == nullptr)
    {
        return;
    }

    this->ForEachCrossSiteInfo([this](ScriptContextOptimizationOverrideInfo * i)
    {
        Assert(i->crossSiteRoot == this->crossSiteRoot);
        Assert(i->sideEffects == this->sideEffects);
        Assert(i->arraySetElementFastPathVtable == this->arraySetElementFastPathVtable);
        Assert(i->intArraySetElementFastPathVtable == this->intArraySetElementFastPathVtable);
        Assert(i->floatArraySetElementFastPathVtable == this->floatArraySetElementFastPathVtable);
    });
}